

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_read_filter_row_avg(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  png_const_bytep pp;
  png_bytep rp;
  ulong uVar4;
  
  uVar2 = (ulong)(row_info->pixel_depth + 7 >> 3);
  uVar1 = row_info->rowbytes;
  uVar4 = uVar2;
  if (row_info->pixel_depth != 0) {
    do {
      *row = *row + (*prev_row >> 1);
      prev_row = prev_row + 1;
      row = row + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (uVar1 != uVar2) {
    lVar3 = 0;
    do {
      row[lVar3] = row[lVar3] + (char)((uint)row[lVar3 - uVar2] + (uint)prev_row[lVar3] >> 1);
      lVar3 = lVar3 + 1;
    } while (uVar1 - uVar2 != lVar3);
  }
  return;
}

Assistant:

static void
png_read_filter_row_avg(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   size_t i;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   size_t istop = row_info->rowbytes - bpp;

   for (i = 0; i < bpp; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         ((int)(*pp++) / 2 )) & 0xff);

      rp++;
   }

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         (int)(*pp++ + *(rp-bpp)) / 2 ) & 0xff);

      rp++;
   }
}